

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
::emplace_new_key<slang::SVInt&>
          (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,SVInt *key)

{
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar1;
  char __tmp_1;
  long lVar2;
  long lVar3;
  char __tmp;
  ulong uVar4;
  undefined7 in_register_00000031;
  anon_union_16_1_a8c68091_for_sherwood_v3_entry<slang::SVInt>_3 *__b;
  int8_t iVar5;
  sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
  sVar6;
  EntryPointer psVar7;
  EntryPointer psVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar11;
  value_type to_insert;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  undefined1 local_34;
  byte local_33;
  
  if (*(long *)(this + 0x10) != 0) {
    uVar4 = CONCAT71(in_register_00000031,distance_from_desired) & 0xffffffff;
    sVar6 = SUB81(uVar4,0);
    if (this[0x19] != sVar6) {
      lVar3 = *(long *)(this + 0x20) + 1;
      auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar9._0_8_ = lVar3;
      auVar9._12_4_ = 0x45300000;
      lVar2 = *(long *)(this + 0x10) + 1;
      auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar10._0_8_ = lVar2;
      auVar10._12_4_ = 0x45300000;
      if ((auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
          (double)*(float *)(this + 0x1c) *
          ((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0))) {
        if (-1 < current_entry->distance_from_desired) {
          slang::SVInt::SVInt((SVInt *)&local_40,&key->super_SVIntStorage);
          iVar5 = current_entry->distance_from_desired;
          current_entry->distance_from_desired = (int8_t)sVar6;
          __b = &current_entry->field_1;
          psVar7 = current_entry;
          do {
            std::swap<slang::SVInt>((SVInt *)&local_40,&__b->value);
            aVar1 = local_40;
            sVar6 = (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                     )(iVar5 + '\x01');
            psVar8 = psVar7;
LAB_001a0010:
            psVar7 = psVar8 + 1;
            iVar5 = psVar7->distance_from_desired;
            if (iVar5 < '\0') {
              psVar8[1].field_1.value.super_SVIntStorage.field_0.val = 0;
              *(uint *)((long)&psVar8[1].field_1 + 8) = local_38;
              *(undefined1 *)((long)&psVar8[1].field_1 + 0xc) = local_34;
              *(byte *)((long)&psVar8[1].field_1 + 0xd) = local_33;
              if (0x40 < local_38 || (local_33 & 1) != 0) {
                local_40.val = 0;
              }
              psVar8[1].field_1.value.super_SVIntStorage.field_0 = aVar1;
              psVar7->distance_from_desired = (int8_t)sVar6;
              *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
              uVar4 = CONCAT71((int7)((ulong)&local_40 >> 8),1);
              goto LAB_001a00c5;
            }
            if ((char)sVar6 <= iVar5) goto code_r0x001a001e;
            psVar7->distance_from_desired = (int8_t)sVar6;
            __b = &psVar8[1].field_1;
          } while( true );
        }
        slang::SVInt::SVInt(&(current_entry->field_1).value,&key->super_SVIntStorage);
        current_entry->distance_from_desired = (int8_t)sVar6;
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        uVar4 = CONCAT71((int7)(uVar4 >> 8),1);
        goto LAB_0019ffbb;
      }
    }
  }
  sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
  ::grow((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
          *)this);
  pVar11 = emplace<slang::SVInt&>(this,key);
  current_entry = (EntryPointer)pVar11.first.current;
  uVar4 = (ulong)pVar11._8_4_;
LAB_0019ffbb:
  pVar11._8_8_ = uVar4 & 0xffffffff;
  pVar11.first.current = current_entry;
  return pVar11;
code_r0x001a001e:
  sVar6 = (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
           )((char)sVar6 + '\x01');
  psVar8 = psVar7;
  if (this[0x19] == sVar6) {
    std::swap<slang::SVInt>((SVInt *)&local_40,&(current_entry->field_1).value);
    sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
    ::grow((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
            *)this);
    pVar11 = sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
             ::emplace<slang::SVInt>
                       ((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                         *)this,(SVInt *)&local_40);
    current_entry = (EntryPointer)pVar11.first.current;
    uVar4 = (ulong)pVar11._8_4_;
LAB_001a00c5:
    slang::SVInt::~SVInt((SVInt *)&local_40);
    goto LAB_0019ffbb;
  }
  goto LAB_001a0010;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }